

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void __thiscall
duckdb::RLECompressState<duckdb::hugeint_t,_true>::RLECompressState
          (RLECompressState<duckdb::hugeint_t,_true> *this,
          ColumnDataCheckpointData *checkpoint_data_p,CompressionInfo *info)

{
  BlockManager *pBVar1;
  CompressionFunction *pCVar2;
  RowGroup *pRVar3;
  idx_t iVar4;
  idx_t iVar5;
  
  (this->super_CompressionState).info.block_manager = info->block_manager;
  (this->super_CompressionState)._vptr_CompressionState =
       (_func_int **)&PTR__RLECompressState_02468058;
  this->checkpoint_data = checkpoint_data_p;
  pCVar2 = ColumnDataCheckpointData::GetCompressionFunction(checkpoint_data_p,COMPRESSION_RLE);
  this->function = pCVar2;
  (this->current_segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(&this->handle);
  (this->state).seen_count = 0;
  (this->state).last_value.lower = 0;
  (this->state).last_value.upper = -0x8000000000000000;
  (this->state).last_seen_count = 0;
  (this->state).dataptr = (void *)0x0;
  (this->state).all_null = true;
  this->entry_count = 0;
  pRVar3 = ColumnDataCheckpointData::GetRowGroup(this->checkpoint_data);
  CreateEmptySegment(this,(pRVar3->super_SegmentBase<duckdb::RowGroup>).start);
  (this->state).dataptr = this;
  pBVar1 = (this->super_CompressionState).info.block_manager;
  iVar4 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar5 = optional_idx::GetIndex(&pBVar1->block_header_size);
  this->max_rle_count = ((iVar4 - iVar5) - 8) / 0x12;
  return;
}

Assistant:

RLECompressState(ColumnDataCheckpointData &checkpoint_data_p, const CompressionInfo &info)
	    : CompressionState(info), checkpoint_data(checkpoint_data_p),
	      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_RLE)) {
		CreateEmptySegment(checkpoint_data.GetRowGroup().start);

		state.dataptr = (void *)this;
		max_rle_count = MaxRLECount();
	}